

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_ce0e01::HandleUploadCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  int iVar4;
  CURLcode CVar5;
  string *cafile;
  string *psVar6;
  FILE *__stream;
  CURL_conflict *data;
  curl_slist *list;
  char *extraout_RDX;
  undefined8 uVar7;
  string *h;
  pointer pbVar8;
  bool bVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value_00;
  string_view value_01;
  cURLProgressHelper helper;
  string err;
  cURLEasyGuard g_curl;
  cmFileCommandVectorOfChar chunkDebug;
  cmFileCommandVectorOfChar chunkResponse;
  string netrc_level;
  string url;
  string filename;
  string logVar;
  string netrc_file;
  string userpwd;
  string statusVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  long local_298;
  char *local_290;
  cmExecutionStatus *local_288;
  byte local_279;
  undefined1 local_278 [48];
  string *local_248;
  long local_240;
  long local_238;
  cURLEasyGuard local_230;
  vector<char,_std::allocator<char>_> local_228;
  vector<char,_std::allocator<char>_> local_208;
  string local_1e8;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  string local_1a8;
  string local_188;
  string local_168;
  undefined1 *local_148;
  long local_140;
  undefined1 local_138;
  undefined7 uStack_137;
  string local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  char *local_68;
  cmAlphaNum local_60;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_288 = status;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    _Var10._M_p = (pointer)&local_2a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffd48,
               "UPLOAD must be called with at least three arguments.","");
    std::__cxx11::string::_M_assign((string *)&local_288->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != &local_2a8) {
      operator_delete(_Var10._M_p,local_2a8._M_allocated_capacity + 1);
    }
    return false;
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  local_1c8 = local_1b8;
  pcVar2 = pbVar1[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  local_188._M_string_length = 0;
  local_188.field_2._M_local_buf[0] = '\0';
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  pcVar3 = local_288->Makefile;
  _Var10._M_p = (pointer)&local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffd48,"CMAKE_TLS_VERIFY","");
  local_279 = cmMakefile::IsOn(pcVar3,(string *)&stack0xfffffffffffffd48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != &local_2a8) {
    operator_delete(_Var10._M_p,local_2a8._M_allocated_capacity + 1);
  }
  pcVar3 = local_288->Makefile;
  _Var10._M_p = (pointer)&local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffd48,"CMAKE_TLS_CAINFO","");
  cafile = (string *)cmMakefile::GetDefinition(pcVar3,(string *)&stack0xfffffffffffffd48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != &local_2a8) {
    operator_delete(_Var10._M_p,local_2a8._M_allocated_capacity + 1);
  }
  local_148 = &local_138;
  local_140 = 0;
  local_138 = 0;
  pcVar3 = local_288->Makefile;
  _Var10._M_p = (pointer)&local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffd48,"CMAKE_NETRC","");
  psVar6 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&stack0xfffffffffffffd48);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,pcVar2 + psVar6->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != &local_2a8) {
    operator_delete(_Var10._M_p,local_2a8._M_allocated_capacity + 1);
  }
  pcVar3 = local_288->Makefile;
  _Var10._M_p = (pointer)&local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffd48,"CMAKE_NETRC_FILE","");
  psVar6 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&stack0xfffffffffffffd48);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar2,pcVar2 + psVar6->_M_string_length);
  psVar6 = pbVar1 + 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != &local_2a8) {
    operator_delete(_Var10._M_p,local_2a8._M_allocated_capacity + 1);
  }
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (psVar6 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    bVar9 = false;
    local_240 = 0;
    local_238 = 0;
  }
  else {
    local_238 = 0;
    local_240 = 0;
    bVar9 = false;
    local_248 = cafile;
    do {
      iVar4 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar4 == 0) {
        psVar6 = psVar6 + 1;
        if (psVar6 == (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          _Var10._M_p = (pointer)&local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffd48,"UPLOAD missing time for TIMEOUT.","");
          std::__cxx11::string::_M_assign((string *)&local_288->Error);
LAB_002df9b3:
          uVar7 = local_2a8._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p == &local_2a8) goto LAB_002df9ce;
          goto LAB_002df9c6;
        }
        local_238 = atol((psVar6->_M_dataplus)._M_p);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)psVar6);
        if (iVar4 == 0) {
          psVar6 = psVar6 + 1;
          if (psVar6 == (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish) {
            _Var10._M_p = (pointer)&local_2a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffffd48,
                       "UPLOAD missing time for INACTIVITY_TIMEOUT.","");
            std::__cxx11::string::_M_assign((string *)&local_288->Error);
            goto LAB_002df9b3;
          }
          local_240 = atol((psVar6->_M_dataplus)._M_p);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)psVar6);
          if (iVar4 == 0) {
            psVar6 = psVar6 + 1;
            if (psVar6 == (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) {
              _Var10._M_p = (pointer)&local_2a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffffd48,"UPLOAD missing VAR for LOG.","");
              std::__cxx11::string::_M_assign((string *)&local_288->Error);
              goto LAB_002df9b3;
            }
            std::__cxx11::string::_M_assign((string *)&local_188);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)psVar6);
            if (iVar4 == 0) {
              psVar6 = psVar6 + 1;
              if (psVar6 == (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish) {
                _Var10._M_p = (pointer)&local_2a8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffffd48,"UPLOAD missing VAR for STATUS.","");
                std::__cxx11::string::_M_assign((string *)&local_288->Error);
                goto LAB_002df9b3;
              }
              std::__cxx11::string::_M_assign((string *)&local_128);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)psVar6);
              if (iVar4 == 0) {
                bVar9 = true;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)psVar6);
                if (iVar4 == 0) {
                  if (psVar6 + 1 ==
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
                    _Var10._M_p = (pointer)&local_2a8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&stack0xfffffffffffffd48,
                               "UPLOAD missing bool value for TLS_VERIFY.","");
                    std::__cxx11::string::_M_assign((string *)&local_288->Error);
                    goto LAB_002df9b3;
                  }
                  value._M_str = extraout_RDX;
                  value._M_len = (size_t)psVar6[1]._M_dataplus._M_p;
                  local_279 = cmValue::IsOn((cmValue *)psVar6[1]._M_string_length,value);
                  psVar6 = psVar6 + 1;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)psVar6);
                  if (iVar4 == 0) {
                    local_248 = psVar6 + 1;
                    psVar6 = local_248;
                    if (local_248 ==
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish) {
                      _Var10._M_p = (pointer)&local_2a8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&stack0xfffffffffffffd48,
                                 "UPLOAD missing file value for TLS_CAINFO.","");
                      std::__cxx11::string::_M_assign((string *)&local_288->Error);
                      goto LAB_002df9b3;
                    }
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)psVar6);
                    if (iVar4 == 0) {
                      if (psVar6 + 1 ==
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) {
                        _Var10._M_p = (pointer)&local_2a8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&stack0xfffffffffffffd48,
                                   "UPLOAD missing file value for NETRC_FILE.","");
                        std::__cxx11::string::_M_assign((string *)&local_288->Error);
                        goto LAB_002df9b3;
                      }
                      std::__cxx11::string::_M_assign((string *)&local_168);
                      psVar6 = psVar6 + 1;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)psVar6);
                      if (iVar4 == 0) {
                        if (psVar6 + 1 ==
                            (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish) {
                          _Var10._M_p = (pointer)&local_2a8;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&stack0xfffffffffffffd48,
                                     "UPLOAD missing level value for NETRC.","");
                          std::__cxx11::string::_M_assign((string *)&local_288->Error);
                          goto LAB_002df9b3;
                        }
                        std::__cxx11::string::_M_assign((string *)&local_1e8);
                        psVar6 = psVar6 + 1;
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)psVar6);
                        if (iVar4 == 0) {
                          if (psVar6 + 1 ==
                              (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish) {
                            _Var10._M_p = (pointer)&local_2a8;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&stack0xfffffffffffffd48,
                                       "UPLOAD missing string for USERPWD.","");
                            std::__cxx11::string::_M_assign((string *)&local_288->Error);
                            goto LAB_002df9b3;
                          }
                          std::__cxx11::string::_M_assign((string *)&local_148);
                          psVar6 = psVar6 + 1;
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)psVar6);
                          if (iVar4 == 0) {
                            psVar6 = psVar6 + 1;
                            if (psVar6 == (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish) {
                              _Var10._M_p = (pointer)&local_2a8;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&stack0xfffffffffffffd48,
                                         "UPLOAD missing string for HTTPHEADER.","");
                              std::__cxx11::string::_M_assign((string *)&local_288->Error);
                              goto LAB_002df9b3;
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&local_108,psVar6);
                          }
                          else {
                            local_2a8._8_8_ = (psVar6->_M_dataplus)._M_p;
                            local_2a8._M_allocated_capacity = psVar6->_M_string_length;
                            _Var10._M_p = (pointer)0x15;
                            views._M_len = 2;
                            views._M_array = (iterator)&stack0xfffffffffffffd48;
                            cmCatViews_abi_cxx11_((string *)local_278,views);
                            cmMakefile::IssueMessage
                                      (local_288->Makefile,AUTHOR_WARNING,(string *)local_278);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_278._0_8_ !=
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(local_278 + 0x10)) {
                              operator_delete((void *)local_278._0_8_,
                                              CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      psVar6 = psVar6 + 1;
      cafile = local_248;
    } while (psVar6 != (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  __stream = (FILE *)cmsys::SystemTools::Fopen(&local_1a8,"rb");
  if (__stream == (FILE *)0x0) {
    local_2a8._M_allocated_capacity = local_1a8._M_string_length;
    local_2a8._8_8_ = local_1a8._M_dataplus._M_p;
    local_298 = 0xe;
    local_290 = "\' for reading.";
    views_00._M_len = 3;
    views_00._M_array = (iterator)&stack0xfffffffffffffd48;
    cmCatViews_abi_cxx11_((string *)local_278,views_00);
    std::__cxx11::string::_M_assign((string *)&local_288->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_278 + 0x10)) {
      uVar7 = (long *)CONCAT71(local_278._17_7_,local_278[0x10]);
      _Var10._M_p = (pointer)local_278._0_8_;
LAB_002df9c6:
      operator_delete(_Var10._M_p,uVar7 + 1);
    }
  }
  else {
    local_248 = (string *)cmsys::SystemTools::FileLength(&local_1a8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_1c8,local_1c0 + (long)local_1c8);
    cmCurlFixFileURL((string *)&stack0xfffffffffffffd48,&local_88);
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&stack0xfffffffffffffd48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != &local_2a8) {
      operator_delete(_Var10._M_p,local_2a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    curl_global_init(3);
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      local_230.Easy = data;
      CVar5 = curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
      if (CVar5 == CURLE_OK) {
        CVar5 = curl_easy_setopt(data,CURLOPT_UPLOAD,1);
        if (CVar5 != CURLE_OK) {
          _Var10._M_p = (pointer)&local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffd48,"UPLOAD cannot set upload flag: ","");
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append(&stack0xfffffffffffffd48);
          std::__cxx11::string::_M_assign((string *)&local_288->Error);
          goto LAB_002df84d;
        }
        CVar5 = curl_easy_setopt(data,CURLOPT_URL,local_1c8);
        if (CVar5 != CURLE_OK) {
          _Var10._M_p = (pointer)&local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffd48,"UPLOAD cannot set url: ","");
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append(&stack0xfffffffffffffd48);
          std::__cxx11::string::_M_assign((string *)&local_288->Error);
          goto LAB_002df84d;
        }
        CVar5 = curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmWriteToMemoryCallback);
        if (CVar5 != CURLE_OK) {
          _Var10._M_p = (pointer)&local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffd48,"UPLOAD cannot set write function: ","");
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append(&stack0xfffffffffffffd48);
          std::__cxx11::string::_M_assign((string *)&local_288->Error);
          goto LAB_002df84d;
        }
        CVar5 = curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmFileCommandCurlDebugCallback);
        if (CVar5 != CURLE_OK) {
          _Var10._M_p = (pointer)&local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffd48,"UPLOAD cannot set debug function: ","");
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append(&stack0xfffffffffffffd48);
          std::__cxx11::string::_M_assign((string *)&local_288->Error);
          goto LAB_002df84d;
        }
        if ((local_279 & 1) == 0) {
          CVar5 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
          if (CVar5 == CURLE_OK) goto LAB_002dfb51;
          _Var10._M_p = (pointer)&local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffd48,"UPLOAD cannot set TLS/SSL Verify off: ","")
          ;
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append(&stack0xfffffffffffffd48);
          std::__cxx11::string::_M_assign((string *)&local_288->Error);
          goto LAB_002df84d;
        }
        CVar5 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,1);
        if (CVar5 != CURLE_OK) {
          _Var10._M_p = (pointer)&local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffd48,"UPLOAD cannot set TLS/SSL Verify on: ","");
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append(&stack0xfffffffffffffd48);
          std::__cxx11::string::_M_assign((string *)&local_288->Error);
          goto LAB_002df84d;
        }
LAB_002dfb51:
        if (cafile == (string *)0x0) {
          cafile = &cmValue::Empty_abi_cxx11_;
        }
        cmCurlSetCAInfo(&local_a8,data,cafile);
        if (local_a8._M_string_length == 0) {
          local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          CVar5 = curl_easy_setopt(data,CURLOPT_WRITEDATA);
          if (CVar5 == CURLE_OK) {
            CVar5 = curl_easy_setopt(data,CURLOPT_DEBUGDATA,&local_228);
            if (CVar5 != CURLE_OK) {
              _Var10._M_p = (pointer)&local_2a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffffd48,"UPLOAD cannot set debug data: ","");
              curl_easy_strerror(CVar5);
              std::__cxx11::string::append(&stack0xfffffffffffffd48);
              std::__cxx11::string::_M_assign((string *)&local_288->Error);
              goto LAB_002dfcd6;
            }
            CVar5 = curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
            if (CVar5 != CURLE_OK) {
              _Var10._M_p = (pointer)&local_2a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffffd48,
                         "UPLOAD cannot set follow-redirect option: ","");
              curl_easy_strerror(CVar5);
              std::__cxx11::string::append(&stack0xfffffffffffffd48);
              std::__cxx11::string::_M_assign((string *)&local_288->Error);
              goto LAB_002dfcd6;
            }
            if ((local_188._M_string_length != 0) &&
               (CVar5 = curl_easy_setopt(data,CURLOPT_VERBOSE,1), CVar5 != CURLE_OK)) {
              _Var10._M_p = (pointer)&local_2a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffffd48,"UPLOAD cannot set verbose: ","");
              curl_easy_strerror(CVar5);
              std::__cxx11::string::append(&stack0xfffffffffffffd48);
              std::__cxx11::string::_M_assign((string *)&local_288->Error);
              goto LAB_002dfcd6;
            }
            if ((0 < local_238) &&
               (CVar5 = curl_easy_setopt(data,CURLOPT_TIMEOUT,local_238), CVar5 != CURLE_OK)) {
              _Var10._M_p = (pointer)&local_2a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffffd48,"UPLOAD cannot set timeout: ","");
              curl_easy_strerror(CVar5);
              std::__cxx11::string::append(&stack0xfffffffffffffd48);
              std::__cxx11::string::_M_assign((string *)&local_288->Error);
              goto LAB_002dfcd6;
            }
            if (0 < local_240) {
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,local_240);
            }
            _Var10._M_p = (pointer)0xffffffffffffffff;
            local_2a8._M_allocated_capacity = (size_type)&local_298;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"upload","");
            if (bVar9) {
              CVar5 = curl_easy_setopt(data,CURLOPT_NOPROGRESS,0);
              if (CVar5 == CURLE_OK) {
                CVar5 = curl_easy_setopt(data,CURLOPT_PROGRESSFUNCTION,cmFileUploadProgressCallback)
                ;
                if (CVar5 == CURLE_OK) {
                  CVar5 = curl_easy_setopt(data,CURLOPT_XFERINFODATA,&stack0xfffffffffffffd48);
                  if (CVar5 == CURLE_OK) goto LAB_002dffd1;
                  local_278._0_8_ = local_278 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_278,"UPLOAD cannot set progress data: ","");
                  curl_easy_strerror(CVar5);
                  std::__cxx11::string::append(local_278);
                  std::__cxx11::string::_M_assign((string *)&local_288->Error);
                }
                else {
                  local_278._0_8_ = local_278 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_278,"UPLOAD cannot set progress function: ","");
                  curl_easy_strerror(CVar5);
                  std::__cxx11::string::append(local_278);
                  std::__cxx11::string::_M_assign((string *)&local_288->Error);
                }
              }
              else {
                local_278._0_8_ = local_278 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_278,"UPLOAD cannot set noprogress value: ","");
                curl_easy_strerror(CVar5);
                std::__cxx11::string::append(local_278);
                std::__cxx11::string::_M_assign((string *)&local_288->Error);
              }
LAB_002e0099:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_278 + 0x10)) {
                operator_delete((void *)local_278._0_8_,
                                CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
              }
              bVar9 = false;
            }
            else {
LAB_002dffd1:
              CVar5 = curl_easy_setopt(data,CURLOPT_READDATA,__stream);
              if (CVar5 != CURLE_OK) {
                local_278._0_8_ = local_278 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_278,"UPLOAD cannot set input file: ","");
                curl_easy_strerror(CVar5);
                std::__cxx11::string::append(local_278);
                std::__cxx11::string::_M_assign((string *)&local_288->Error);
                goto LAB_002e0099;
              }
              CVar5 = curl_easy_setopt(data,CURLOPT_INFILESIZE,local_248);
              if (CVar5 != CURLE_OK) {
                local_278._0_8_ = local_278 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_278,"UPLOAD cannot set input file size: ","");
                curl_easy_strerror(CVar5);
                std::__cxx11::string::append(local_278);
                std::__cxx11::string::_M_assign((string *)&local_288->Error);
                goto LAB_002e0099;
              }
              if ((local_140 != 0) &&
                 (CVar5 = curl_easy_setopt(data,CURLOPT_USERPWD,local_148), CVar5 != CURLE_OK)) {
                local_278._0_8_ = local_278 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_278,"UPLOAD cannot set user password: ","");
                curl_easy_strerror(CVar5);
                std::__cxx11::string::append(local_278);
                std::__cxx11::string::_M_assign((string *)&local_288->Error);
                goto LAB_002e0099;
              }
              cmsys::SystemTools::UpperCase((string *)local_278,&local_1e8);
              std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_278);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_278 + 0x10)) {
                operator_delete((void *)local_278._0_8_,
                                CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
              }
              cmCurlSetNETRCOption(&local_c8,data,&local_1e8,&local_168);
              pbVar1 = local_108.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              bVar9 = local_c8._M_string_length == 0;
              if (bVar9) {
                list = (curl_slist *)0x0;
                for (pbVar8 = local_108.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1;
                    pbVar8 = pbVar8 + 1) {
                  list = curl_slist_append(list,(pbVar8->_M_dataplus)._M_p);
                }
                curl_easy_setopt(data,CURLOPT_HTTPHEADER,list);
                CVar5 = curl_easy_perform(data);
                curl_slist_free_all(list);
                local_230.Easy = (CURL_conflict *)0x0;
                curl_easy_cleanup((Curl_easy *)_Var10._M_p);
                if (local_128._M_string_length != 0) {
                  pcVar3 = local_288->Makefile;
                  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_278,CVar5);
                  local_60.View_._M_len = 2;
                  local_60.View_._M_str = ";\"";
                  local_68 = curl_easy_strerror(CVar5);
                  cmStrCat<char_const*,char[2]>
                            (&local_e8,(cmAlphaNum *)local_278,&local_60,&local_68,
                             (char (*) [2])0x722c5b);
                  value_00._M_str = local_e8._M_dataplus._M_p;
                  value_00._M_len = local_e8._M_string_length;
                  cmMakefile::AddDefinition(pcVar3,&local_128,value_00);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                }
                curl_global_cleanup();
                fclose(__stream);
                if (local_188._M_string_length != 0) {
                  local_278._0_8_ = local_278 + 0x10;
                  local_278._8_8_ = (char *)0x0;
                  local_278[0x10] = '\0';
                  if (local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    local_60.View_._M_len = local_60.View_._M_len & 0xffffffffffffff00;
                    std::vector<char,_std::allocator<char>_>::emplace_back<char>
                              (&local_208,(char *)&local_60);
                    std::__cxx11::string::append(local_278);
                    std::__cxx11::string::append(local_278);
                    std::__cxx11::string::append(local_278);
                  }
                  if (local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    local_60.View_._M_len = local_60.View_._M_len & 0xffffffffffffff00;
                    std::vector<char,_std::allocator<char>_>::emplace_back<char>
                              (&local_228,(char *)&local_60);
                    std::__cxx11::string::append(local_278);
                    std::__cxx11::string::append(local_278);
                    std::__cxx11::string::append(local_278);
                  }
                  value_01._M_str = (char *)local_278._0_8_;
                  value_01._M_len = local_278._8_8_;
                  cmMakefile::AddDefinition(local_288->Makefile,&local_188,value_01);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_278 + 0x10)) {
                    operator_delete((void *)local_278._0_8_,
                                    CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
                  }
                }
              }
              else {
                std::__cxx11::string::_M_assign((string *)&local_288->Error);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if ((long *)local_2a8._M_allocated_capacity != &local_298) {
              operator_delete((void *)local_2a8._M_allocated_capacity,local_298 + 1);
            }
          }
          else {
            _Var10._M_p = (pointer)&local_2a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffffd48,"UPLOAD cannot set write data: ","");
            curl_easy_strerror(CVar5);
            std::__cxx11::string::append(&stack0xfffffffffffffd48);
            std::__cxx11::string::_M_assign((string *)&local_288->Error);
LAB_002dfcd6:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_2a8) {
              operator_delete(_Var10._M_p,local_2a8._M_allocated_capacity + 1);
            }
            bVar9 = false;
          }
          if (local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_288->Error);
          bVar9 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        _Var10._M_p = (pointer)&local_2a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffd48,"UPLOAD cannot set fail on error flag: ","");
        curl_easy_strerror(CVar5);
        std::__cxx11::string::append(&stack0xfffffffffffffd48);
        std::__cxx11::string::_M_assign((string *)&local_288->Error);
LAB_002df84d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_2a8) {
          operator_delete(_Var10._M_p,local_2a8._M_allocated_capacity + 1);
        }
        bVar9 = false;
      }
      cURLEasyGuard::~cURLEasyGuard(&local_230);
      goto LAB_002df9d0;
    }
    _Var10._M_p = (pointer)&local_2a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffd48,"UPLOAD error initializing curl.","");
    std::__cxx11::string::_M_assign((string *)&local_288->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != &local_2a8) {
      operator_delete(_Var10._M_p,local_2a8._M_allocated_capacity + 1);
    }
    fclose(__stream);
  }
LAB_002df9ce:
  bVar9 = false;
LAB_002df9d0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,CONCAT71(uStack_137,local_138) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,
                    CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                             local_188.field_2._M_local_buf[0]) + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  return bVar9;
}

Assistant:

bool HandleUploadCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  if (args.size() < 3) {
    status.SetError("UPLOAD must be called with at least three arguments.");
    return false;
  }
  auto i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;
  bool tls_verify = status.GetMakefile().IsOn("CMAKE_TLS_VERIFY");
  cmValue cainfo = status.GetMakefile().GetDefinition("CMAKE_TLS_CAINFO");
  std::string userpwd;
  std::string netrc_level =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC_FILE");

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmIsOn(*i);
      } else {
        status.SetError("UPLOAD missing bool value for TLS_VERIFY.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = cmValue(*i);
      } else {
        status.SetError("UPLOAD missing file value for TLS_CAINFO.");
        return false;
      }
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        status.SetError("UPLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        status.SetError("UPLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = cmStrCat("Unexpected argument: ", *i);
      status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    ++i;
  }

  // Open file for reading:
  //
  FILE* fin = cmsys::SystemTools::Fopen(filename, "rb");
  if (!fin) {
    std::string errStr =
      cmStrCat("UPLOAD cannot open file '", filename, "' for reading.");
    status.SetError(errStr);
    return false;
  }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

  url = cmCurlFixFileURL(url);

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    status.SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
  }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res =
    ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify off: ");
  }

  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    status.SetError(cainfo_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "UPLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(&status.GetMakefile(), "upload");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
  }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res =
    ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "UPLOAD cannot set user password: ");
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    status.SetError(netrc_option_err);
    return false;
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    status.GetMakefile().AddDefinition(
      statusVar,
      cmStrCat(static_cast<int>(res), ";\"", ::curl_easy_strerror(res), "\""));
  }

  ::curl_global_cleanup();

  fclose(fin);
  fin = nullptr;

  if (!logVar.empty()) {
    std::string log;

    if (!chunkResponse.empty()) {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += chunkResponse.data();
      log += "\n";
    }

    if (!chunkDebug.empty()) {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += chunkDebug.data();
      log += "\n";
    }

    status.GetMakefile().AddDefinition(logVar, log);
  }

  return true;
#else
  status.SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}